

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void __thiscall CS248::DynamicScene::Scene::~Scene(Scene *this)

{
  pointer pfVar1;
  pointer ppSVar2;
  pointer ppPVar3;
  pointer ppDVar4;
  
  pfVar1 = (this->spotLightRotationSpeeds_).super__Vector_base<float,_std::allocator<float>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  ppSVar2 = (this->spotLights_).
            super__Vector_base<CS248::StaticScene::SpotLight_*,_std::allocator<CS248::StaticScene::SpotLight_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppSVar2 != (pointer)0x0) {
    operator_delete(ppSVar2);
  }
  ppPVar3 = (this->pointLights_).
            super__Vector_base<CS248::StaticScene::PointLight_*,_std::allocator<CS248::StaticScene::PointLight_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppPVar3 != (pointer)0x0) {
    operator_delete(ppPVar3);
  }
  ppDVar4 = (this->directionalLights_).
            super__Vector_base<CS248::StaticScene::DirectionalLight_*,_std::allocator<CS248::StaticScene::DirectionalLight_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppDVar4 != (pointer)0x0) {
    operator_delete(ppDVar4);
  }
  std::
  _Rb_tree<CS248::DynamicScene::SceneLight_*,_CS248::DynamicScene::SceneLight_*,_std::_Identity<CS248::DynamicScene::SceneLight_*>,_std::less<CS248::DynamicScene::SceneLight_*>,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  ::~_Rb_tree(&(this->lights_)._M_t);
  std::
  _Rb_tree<CS248::DynamicScene::SceneObject_*,_CS248::DynamicScene::SceneObject_*,_std::_Identity<CS248::DynamicScene::SceneObject_*>,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  ::~_Rb_tree(&(this->objects_)._M_t);
  return;
}

Assistant:

Scene::~Scene() { }